

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O0

int LaunchMultiCliTCPSrv(char *port,_func_int_SOCKET_void_ptr *handlecli,void *pParam)

{
  int iVar1;
  undefined8 *pParam_00;
  HANDLECLITHREADPARAM *pHandlecliThreadParam;
  THREAD_IDENTIFIER handlecliThreadId;
  SOCKET local_30;
  SOCKET sockcli;
  SOCKET socksrv;
  int iResult;
  void *pParam_local;
  _func_int_SOCKET_void_ptr *handlecli_local;
  char *port_local;
  
  sockcli = 1;
  local_30 = -1;
  handlecliThreadId._4_4_ = -1;
  _socksrv = pParam;
  pParam_local = handlecli;
  handlecli_local = (_func_int_SOCKET_void_ptr *)port;
  iVar1 = inittcpsrv(&local_30,"0.0.0.0",port,0x1000,10000);
  if (iVar1 == 0) {
    do {
      while (sockcli = waitforclifortcpsrv(local_30,(SOCKET *)((long)&handlecliThreadId + 4),10000),
            sockcli == 0) {
        pParam_00 = (undefined8 *)calloc(1,0x18);
        if (pParam_00 == (undefined8 *)0x0) {
          disconnectclifromtcpsrv(handlecliThreadId._4_4_);
        }
        else {
          *pParam_00 = pParam_local;
          *(SOCKET *)(pParam_00 + 1) = handlecliThreadId._4_4_;
          pParam_00[2] = _socksrv;
          iVar1 = CreateDefaultThread(handlecliThreadProc,pParam_00,
                                      (THREAD_IDENTIFIER *)&pHandlecliThreadParam);
          if (iVar1 == 0) {
            DetachThread((THREAD_IDENTIFIER)pHandlecliThreadParam);
          }
          else {
            free(pParam_00);
            disconnectclifromtcpsrv(handlecliThreadId._4_4_);
          }
        }
      }
    } while (sockcli == 2);
    releasetcpsrv(local_30);
  }
  return 1;
}

Assistant:

inline int LaunchMultiCliTCPSrv(char* port, int (*handlecli)(SOCKET, void*), void* pParam)
{
	int iResult = EXIT_FAILURE;
	SOCKET socksrv = INVALID_SOCKET;
	SOCKET sockcli = INVALID_SOCKET;
	THREAD_IDENTIFIER handlecliThreadId;
	HANDLECLITHREADPARAM* pHandlecliThreadParam = NULL;

	if (inittcpsrv(&socksrv, "0.0.0.0", port, SOMAXCONN, DEFAULT_SOCK_TIMEOUT) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	for (;;)
	{
		iResult = waitforclifortcpsrv(socksrv, &sockcli, DEFAULT_SOCK_TIMEOUT);
		switch (iResult)
		{
		case EXIT_SUCCESS:		
			pHandlecliThreadParam = (HANDLECLITHREADPARAM*)calloc(1, sizeof(HANDLECLITHREADPARAM));
			if (!pHandlecliThreadParam)	
			{
				PRINT_DEBUG_WARNING_OSNET(("LaunchMultiCliTCPSrv warning (%s) : %s\n", 
					strtime_m(), 
					"Unable to handle new client. "));
				if (disconnectclifromtcpsrv(sockcli) != EXIT_SUCCESS)
				{
					PRINT_DEBUG_WARNING_OSNET(("LaunchMultiCliTCPSrv warning (%s) : %s\n", 
						strtime_m(), 
						"Error disconnecting a client. "));
				}
				break;
			}
			pHandlecliThreadParam->handlecli = handlecli;
			pHandlecliThreadParam->sockcli = sockcli;
			pHandlecliThreadParam->pParam = pParam;
			if (CreateDefaultThread(handlecliThreadProc, pHandlecliThreadParam, &handlecliThreadId) != EXIT_SUCCESS)
			{
				PRINT_DEBUG_WARNING_OSNET(("LaunchMultiCliTCPSrv warning (%s) : %s\n", 
					strtime_m(), 
					"Unable to handle new client. "));
				free(pHandlecliThreadParam);
				if (disconnectclifromtcpsrv(sockcli) != EXIT_SUCCESS)
				{
					PRINT_DEBUG_WARNING_OSNET(("LaunchMultiCliTCPSrv warning (%s) : %s\n", 
						strtime_m(), 
						"Error disconnecting a client. "));
				}
				break;
			}
			if (DetachThread(handlecliThreadId) != EXIT_SUCCESS)
			{
				PRINT_DEBUG_WARNING_OSNET(("LaunchMultiCliTCPSrv warning (%s) : %s\n", 
					strtime_m(), 
					"Error processing new client. "));
			}
			break;
		case EXIT_TIMEOUT:
			break;
		default:
			releasetcpsrv(socksrv);
			return EXIT_FAILURE;
		}
	}

	if (releasetcpsrv(socksrv) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}